

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O1

void __thiscall
iu_UnitStringTest_x_iutest_x_OwnWcsicmpNegativeGT_Test::Body
          (iu_UnitStringTest_x_iutest_x_OwnWcsicmpNegativeGT_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  wint_t wVar2;
  wint_t wVar3;
  ExpressionLHS<bool> *this_00;
  undefined1 *puVar4;
  char *in_R9;
  long lVar5;
  uint uVar6;
  AssertionResult iutest_ar;
  int *in_stack_fffffffffffffdc8;
  AssertionResult local_230;
  AssertionHelper local_208;
  string local_1d8;
  undefined1 local_1b8 [32];
  bool local_198;
  ios_base local_138 [264];
  
  local_1d8._M_dataplus._M_p._0_1_ = 0;
  this_00 = (ExpressionLHS<bool> *)&local_208;
  iutest::detail::ExpressionLHS<bool>::ExpressionLHS(this_00,(bool *)&local_1d8);
  iutest::detail::ExpressionLHS<bool>::GetResult((AssertionResult *)local_1b8,this_00,true);
  paVar1 = &local_230.m_message.field_2;
  local_230.m_message._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,CONCAT44(local_1b8._4_4_,local_1b8._0_4_),
             local_1b8._8_8_ + CONCAT44(local_1b8._4_4_,local_1b8._0_4_));
  local_230.m_result = local_198;
  if ((undefined1 *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_) != local_1b8 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_),local_1b8._16_8_ + 1);
  }
  if ((pointer)local_208.m_part_result.super_iuCodeMessage.m_message._M_string_length !=
      (pointer)((long)&local_208.m_part_result.super_iuCodeMessage.m_message.field_2 + 8)) {
    operator_delete((void *)local_208.m_part_result.super_iuCodeMessage.m_message._M_string_length,
                    local_208.m_part_result.super_iuCodeMessage.m_message.field_2._8_8_ + 1);
  }
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_1d8,(internal *)&local_230,
               (AssertionResult *)
               "IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((!(sizeof(::std::wint_t) >= sizeof(int) && (sizeof(wchar_t) > 2 || ::iutest_type_traits::is_signed<wchar_t>::value))))"
               ,"false","true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,
               (char *)CONCAT71(local_1d8._M_dataplus._M_p._1_7_,local_1d8._M_dataplus._M_p._0_1_),
               (allocator<char> *)&stack0xfffffffffffffdcf);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0x62;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 0xfffffffd;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    (int)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) !=
        &local_208.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               (int)local_208.m_part_result.super_iuCodeMessage.m_message.
                                    _M_dataplus._M_p),
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    puVar4 = (undefined1 *)
             CONCAT71(local_1d8._M_dataplus._M_p._1_7_,local_1d8._M_dataplus._M_p._0_1_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar4 != &local_1d8.field_2) {
LAB_00156cf4:
      operator_delete(puVar4,local_1d8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_230.m_message._M_dataplus._M_p,
                      CONCAT71(local_230.m_message.field_2._M_allocated_capacity._1_7_,
                               local_230.m_message.field_2._M_local_buf[0]) + 1);
    }
    local_1b8._0_4_ = 0;
    lVar5 = 0;
    do {
      wVar3 = *(wint_t *)((long)&DAT_00171c30 + lVar5);
      if (*(wint_t *)((long)L"AAA" + lVar5) == 0) {
        wVar2 = towupper(0);
        wVar3 = towupper(wVar3);
        local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = wVar2 - wVar3
        ;
        break;
      }
      wVar2 = towupper(*(wint_t *)((long)L"AAA" + lVar5));
      wVar3 = towupper(wVar3);
      lVar5 = lVar5 + 4;
      uVar6 = wVar2 - wVar3;
      this_00 = (ExpressionLHS<bool> *)((ulong)this_00 & 0xffffffff);
      if (uVar6 != 0) {
        this_00 = (ExpressionLHS<bool> *)(ulong)uVar6;
      }
      local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = (int)this_00;
    } while (uVar6 == 0);
    if ((int)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p <
        (int)local_1b8._0_4_) {
      local_230.m_message._M_dataplus._M_p = (pointer)&local_230.m_message.field_2;
      local_230.m_message._M_string_length = 0;
      local_230.m_message.field_2._M_local_buf[0] = '\0';
      local_230.m_result = true;
    }
    else {
      iutest::internal::CmpHelperOpFailure<int,int>
                (&local_230,(internal *)0x171a14,
                 "::iutest::detail::wrapper::iu_wcsicmp(L\"AAA\", negative_sample)",">",local_1b8,
                 (int *)&local_208,in_stack_fffffffffffffdc8);
    }
    if (local_230.m_result != false) goto LAB_00156d1d;
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,local_230.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_1d8);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 99;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_1b8,false);
    puVar4 = (undefined1 *)
             CONCAT44(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      (int)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p);
    local_1d8.field_2._M_allocated_capacity =
         local_208.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar4 != &local_208.m_part_result.super_iuCodeMessage.m_message.field_2)
    goto LAB_00156cf4;
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
LAB_00156d1d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.m_message._M_dataplus._M_p != &local_230.m_message.field_2) {
    operator_delete(local_230.m_message._M_dataplus._M_p,
                    CONCAT71(local_230.m_message.field_2._M_allocated_capacity._1_7_,
                             local_230.m_message.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

IUTEST(UnitStringTest, OwnWcsicmpNegativeGT)
{
    const wchar_t negative = static_cast<wchar_t>(-1);
    const wchar_t negative_sample[] = { L'a', L'a', L'a', negative, L'\0' };
    IUTEST_ASSUME(!(sizeof(::std::wint_t) >= sizeof(int) && (sizeof(wchar_t) > 2 || ::iutest_type_traits::is_signed<wchar_t>::value)));
    IUTEST_EXPECT_GT(0, ::iutest::detail::wrapper::iu_wcsicmp(L"AAA", negative_sample));
}